

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

void Am_Stop_Widget(Am_Object *widget,Am_Value *final_value)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Value local_60;
  Am_Object local_50;
  undefined1 local_48 [8];
  Am_Explicit_Widget_Run_Method method;
  undefined1 local_28 [8];
  Am_Value v;
  Am_Value *final_value_local;
  Am_Object *widget_local;
  
  v.value = (anon_union_8_8_ea4c8939_for_value)final_value;
  Am_Value::Am_Value((Am_Value *)local_28);
  in_value = Am_Object::Peek(widget,0x1e9,0);
  Am_Value::operator=((Am_Value *)local_28,in_value);
  bVar1 = Am_Value::Valid((Am_Value *)local_28);
  if (bVar1) {
    Am_Explicit_Widget_Run_Method::Am_Explicit_Widget_Run_Method
              ((Am_Explicit_Widget_Run_Method *)local_48,(Am_Value *)local_28);
    Am_Object::Am_Object(&local_50,widget);
    Am_Value::Am_Value(&local_60,final_value);
    (*(code *)method.from_wrapper)(&local_50,&local_60);
    Am_Value::~Am_Value(&local_60);
    Am_Object::~Am_Object(&local_50);
  }
  Am_Value::~Am_Value((Am_Value *)local_28);
  return;
}

Assistant:

void
Am_Stop_Widget(Am_Object widget, Am_Value final_value)
{
  Am_Value v;
  v = widget.Peek(Am_WIDGET_STOP_METHOD);
  if (v.Valid()) {
    Am_Explicit_Widget_Run_Method method = v;
    method.Call(widget, final_value);
  }
}